

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O0

int lcopy(lua_State *L)

{
  undefined8 *puVar1;
  boxstm *box;
  lua_State *L_local;
  
  puVar1 = (undefined8 *)lua_touserdata(L,1);
  stm_grab((stm_object *)*puVar1);
  lua_pushlightuserdata(L,(void *)*puVar1);
  return 1;
}

Assistant:

static int
lcopy(lua_State *L) {
	struct boxstm * box = lua_touserdata(L, 1);
	stm_grab(box->obj);
	lua_pushlightuserdata(L, box->obj);
	return 1;
}